

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O3

void Gia_ManReprToAigRepr2(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Aig_Obj_t *pNode2;
  Aig_Obj_t *pNode1;
  long lVar6;
  long lVar7;
  
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1cf,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("pGia->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1d0,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  uVar3 = pGia->nObjs;
  if (0 < (int)uVar3) {
    lVar7 = 2;
    lVar6 = 0;
    do {
      pGVar1 = pGia->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar5 = (ulong)(uint)pGia->pReprs[lVar6] & 0xfffffff;
      if (uVar5 != 0xfffffff) {
        if (uVar3 <= (uint)uVar5) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((int)pGVar1[uVar5].Value < 0) {
LAB_0064a118:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        pVVar2 = pAig->vObjs;
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          if (*(int *)(&pGVar1->field_0x0 + lVar7 * 4) < 0) goto LAB_0064a118;
          pNode1 = (Aig_Obj_t *)0x0;
          pNode2 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar3 = pGVar1[uVar5].Value >> 1;
          if (pVVar2->nSize <= (int)uVar3) {
LAB_0064a137:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if ((int)*(uint *)(&pGVar1->field_0x0 + lVar7 * 4) < 0) goto LAB_0064a118;
          uVar4 = *(uint *)(&pGVar1->field_0x0 + lVar7 * 4) >> 1;
          if ((uint)pVVar2->nSize <= uVar4) goto LAB_0064a137;
          pNode1 = (Aig_Obj_t *)pVVar2->pArray[uVar3];
          pNode2 = (Aig_Obj_t *)pVVar2->pArray[uVar4];
        }
        Aig_ObjCreateRepr(pAig,pNode1,pNode2);
        uVar3 = pGia->nObjs;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 3;
    } while (lVar6 < (int)uVar3);
  }
  return;
}

Assistant:

void Gia_ManReprToAigRepr2( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pGiaObj, * pGiaRepr;
    int i;
    assert( pAig->pReprs == NULL );
    assert( pGia->pReprs != NULL );
    // set the pointers to the nodes in AIG
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Gia_ManForEachObj( pGia, pGiaObj, i )
    {
        pGiaRepr = Gia_ObjReprObj( pGia, i );
        if ( pGiaRepr == NULL )
            continue;
        Aig_ObjCreateRepr( pAig, Aig_ManObj(pAig, Abc_Lit2Var(pGiaRepr->Value)), Aig_ManObj(pAig, Abc_Lit2Var(pGiaObj->Value)) );
    }
}